

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functions_core.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
Return<std::vector<int,std::allocator<int>>>::
get<_Into<std::vector<int,std::allocator<int>>,BackInserter<std::vector<int,std::allocator<int>>>>>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          Return<std::vector<int,std::allocator<int>>> *this,
          _Into<std::vector<int,_std::allocator<int>_>,_BackInserter<std::vector<int,_std::allocator<int>_>_>_>
          *node)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  piVar1 = *(pointer *)(this + 0x10);
  piVar2 = *(pointer *)this;
  piVar3 = *(pointer *)(this + 8);
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = piVar2;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = piVar3;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = piVar1;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

static _T get(_Node& node)
    {
        return std::move(node.get());
    }